

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O3

void Parse(lemon *gp)

{
  byte *pbVar1;
  ushort *puVar2;
  int iVar3;
  int iVar4;
  FILE *__stream;
  ulong uVar5;
  byte *filebuf;
  size_t sVar6;
  long lVar7;
  long lVar8;
  byte *pbVar9;
  ushort **ppuVar10;
  rule *prVar11;
  undefined8 *puVar12;
  symbol *psVar13;
  symbol **ppsVar14;
  symbol *psVar15;
  undefined8 *puVar16;
  long *__ptr;
  void *pvVar17;
  byte bVar18;
  ulong uVar19;
  char *pcVar20;
  char cVar21;
  int iVar22;
  int iVar23;
  byte *__s2;
  byte bVar24;
  byte bVar25;
  char *pcVar26;
  uint uVar27;
  uint uVar28;
  size_t sVar29;
  long lVar30;
  byte *pbVar31;
  byte *pbVar32;
  byte *pbVar33;
  ulong uVar34;
  ulong uVar35;
  char **ppcVar36;
  bool bVar37;
  bool bVar38;
  size_t local_3fd0;
  int local_3fac;
  char local_3f78 [56];
  char *local_3f40;
  uint local_3f38;
  int local_3f34;
  byte *local_3f30;
  lemon *local_3f28;
  undefined4 local_3f20;
  symbol *local_3f18;
  symbol *local_3f10;
  symbol *local_3f08;
  byte *local_3f00;
  uint local_3ef8;
  long alStack_3ef0 [999];
  undefined8 auStack_1fb8 [1001];
  rule *local_70;
  byte *local_68;
  char **local_60;
  int local_58;
  int *local_50;
  undefined4 local_48;
  int iStack_44;
  rule *prStack_40;
  undefined4 uStack_38;
  undefined4 uStack_34;
  
  memset(&local_3f38,0,0x3f08);
  pcVar20 = gp->filename;
  local_3f20 = 0;
  local_3f40 = pcVar20;
  local_3f28 = gp;
  __stream = fopen(pcVar20,"rb");
  if (__stream == (FILE *)0x0) {
    Parse_cold_11();
  }
  else {
    fseek(__stream,0,2);
    uVar5 = ftell(__stream);
    rewind(__stream);
    filebuf = (byte *)malloc((long)((uVar5 << 0x20) + 0x100000000) >> 0x20);
    if (((int)uVar5 < 0x5f5e101) && (filebuf != (byte *)0x0)) {
      sVar29 = (long)(uVar5 << 0x20) >> 0x20;
      sVar6 = fread(filebuf,1,sVar29,__stream);
      if (sVar6 != sVar29) {
        ErrorMsg(pcVar20,0,"Can\'t read in all %d bytes of this file.",uVar5 & 0xffffffff);
        free(filebuf);
        gp->errorcnt = gp->errorcnt + 1;
        fclose(__stream);
        return;
      }
      fclose(__stream);
      iVar3 = strip_crlf((char *)filebuf,(int)uVar5);
      filebuf[iVar3] = 0;
      ppcVar36 = azDefine;
      iVar3 = nDefine;
      uVar5 = (ulong)(uint)nDefine;
      lVar7 = (long)nDefine;
      pbVar33 = filebuf + 6;
      lVar30 = 0;
      iVar23 = 0;
      local_3fac = 0;
      uVar34 = 6;
      pbVar31 = filebuf + 1;
      pbVar32 = filebuf;
      do {
        bVar24 = filebuf[lVar30];
        if (bVar24 != 10) {
          if (bVar24 == 0x25) {
            pbVar9 = filebuf + lVar30;
            if ((lVar30 == 0) || (pbVar9[-1] == 10)) {
              iVar4 = strncmp((char *)pbVar9,"%endif",6);
              if ((iVar4 == 0) &&
                 (ppuVar10 = __ctype_b_loc(),
                 (*(byte *)((long)*ppuVar10 + (ulong)pbVar9[6] * 2 + 1) & 0x20) != 0)) {
                pbVar9 = pbVar32;
                if (iVar23 == 0) {
                  iVar23 = 0;
                }
                else {
                  iVar23 = iVar23 + -1;
                  if (iVar23 == 0) {
                    lVar8 = (long)local_3fac;
                    if (lVar8 < lVar30) {
                      do {
                        if (filebuf[lVar8] != 10) {
                          filebuf[lVar8] = 0x20;
                        }
                        lVar8 = lVar8 + 1;
                      } while (lVar30 != lVar8);
                    }
                    iVar23 = 0;
                  }
                }
                for (; (*pbVar9 != 0 && (*pbVar9 != 10)); pbVar9 = pbVar9 + 1) {
                  *pbVar9 = 0x20;
                }
              }
              else {
                iVar4 = strncmp((char *)pbVar9,"%ifdef",6);
                if (((iVar4 == 0) &&
                    (ppuVar10 = __ctype_b_loc(),
                    (*(byte *)((long)*ppuVar10 + (ulong)pbVar9[6] * 2 + 1) & 0x20) != 0)) ||
                   ((iVar4 = strncmp((char *)pbVar9,"%ifndef",7), iVar4 == 0 &&
                    (ppuVar10 = __ctype_b_loc(),
                    (*(byte *)((long)*ppuVar10 + (ulong)pbVar9[7] * 2 + 1) & 0x20) != 0)))) {
                  if (iVar23 == 0) {
                    ppuVar10 = __ctype_b_loc();
                    uVar19 = uVar34;
                    __s2 = pbVar33;
                    do {
                      pbVar1 = __s2 + 1;
                      __s2 = __s2 + 1;
                      uVar19 = uVar19 + 1;
                    } while ((*(byte *)((long)*ppuVar10 + (ulong)*pbVar1 * 2 + 1) & 0x20) != 0);
                    bVar24 = filebuf[uVar19 & 0xffffffff];
                    bVar38 = false;
                    uVar35 = 0;
                    if (bVar24 != 0) {
                      uVar35 = 0;
                      do {
                        if ((*(byte *)((long)*ppuVar10 + (ulong)bVar24 * 2 + 1) & 0x20) != 0) break;
                        bVar24 = (filebuf + 1)[uVar35 + (uVar19 & 0xffffffff)];
                        uVar35 = uVar35 + 1;
                      } while (bVar24 != 0);
                    }
                    if (iVar3 < 1) {
                      bVar37 = true;
                    }
                    else {
                      bVar38 = true;
                      uVar19 = 1;
                      do {
                        pcVar20 = ppcVar36[uVar19 - 1];
                        iVar23 = strncmp(pcVar20,(char *)__s2,uVar35 & 0xffffffff);
                        if ((iVar23 == 0) && (sVar6 = strlen(pcVar20), (int)uVar35 == (int)sVar6)) {
                          bVar37 = false;
                          goto LAB_0010688e;
                        }
                        bVar38 = (long)uVar19 < lVar7;
                        bVar37 = uVar19 != uVar5;
                        uVar19 = uVar19 + 1;
                      } while (bVar37);
                      bVar37 = true;
                    }
LAB_0010688e:
                    if (pbVar9[3] != 0x6e) {
                      bVar38 = bVar37;
                    }
                    if (bVar38) {
                      iVar23 = 1;
                      local_3fac = (int)lVar30;
                    }
                    else {
                      iVar23 = 0;
                    }
                  }
                  else {
                    iVar23 = iVar23 + 1;
                  }
                  bVar24 = 0x25;
                  pbVar9 = pbVar31;
                  while ((bVar24 != 0 && (bVar24 != 10))) {
                    pbVar9[-1] = 0x20;
                    bVar24 = *pbVar9;
                    pbVar9 = pbVar9 + 1;
                  }
                }
              }
            }
          }
          else if (bVar24 == 0) goto LAB_001068d5;
        }
        lVar30 = lVar30 + 1;
        pbVar32 = pbVar32 + 1;
        pbVar33 = pbVar33 + 1;
        uVar34 = uVar34 + 1;
        pbVar31 = pbVar31 + 1;
      } while( true );
    }
    Parse_cold_10();
  }
  return;
LAB_001068d5:
  if (iVar23 != 0) {
    Parse_cold_1();
    if (x2a != (s_x2 *)0x0) {
      return;
    }
    return;
  }
  pbVar33 = filebuf;
  uVar27 = 1;
LAB_001068e9:
  do {
    uVar5 = (ulong)*pbVar33;
    pbVar31 = pbVar33;
    while( true ) {
      cVar21 = (char)uVar5;
      iVar3 = (int)uVar5;
      if (cVar21 == '\n') {
        uVar27 = uVar27 + 1;
      }
      else if (iVar3 == 0) {
        free(filebuf);
        gp->rule = prStack_40;
        gp->errorcnt = local_3f34;
        return;
      }
      ppuVar10 = __ctype_b_loc();
      if ((*(byte *)((long)*ppuVar10 + uVar5 * 2 + 1) & 0x20) != 0) {
        pbVar33 = pbVar31 + 1;
        goto LAB_001068e9;
      }
      pbVar32 = pbVar31;
      uVar28 = uVar27;
      if (cVar21 != '/') {
        if (cVar21 != '{') {
          if (iVar3 == 0x22) {
            do {
              pbVar33 = pbVar32 + 1;
              while( true ) {
                pbVar32 = pbVar33;
                bVar24 = *pbVar32;
                if (bVar24 == 10) break;
                pbVar33 = pbVar32 + 1;
                local_3f38 = uVar27;
                local_3f30 = pbVar31;
                if (bVar24 == 0x22) goto LAB_00106b90;
                if (bVar24 == 0) {
                  Parse_cold_2();
                  pbVar33 = pbVar32;
                  goto LAB_00106b90;
                }
              }
              uVar28 = uVar28 + 1;
            } while( true );
          }
          goto LAB_001069dd;
        }
        bVar24 = pbVar31[1];
        pbVar33 = pbVar31 + 1;
        if (bVar24 == 0) goto LAB_001076c2;
        iVar3 = 1;
        pbVar9 = pbVar31;
        goto LAB_00106a6f;
      }
      if (pbVar31[1] != 0x2f) break;
      pbVar31 = pbVar31 + 2;
      while( true ) {
        bVar24 = *pbVar31;
        uVar5 = (ulong)bVar24;
        if ((bVar24 == 0) || (bVar24 == 10)) break;
        pbVar31 = pbVar31 + 1;
      }
    }
    if (pbVar31[1] != 0x2a) {
LAB_001069dd:
      puVar2 = *ppuVar10;
      if ((puVar2[uVar5] & 8) == 0) {
        if ((cVar21 == '/') || (iVar3 == 0x7c)) {
          if ((*(byte *)((long)puVar2 + (ulong)pbVar31[1] * 2 + 1) & 4) == 0) goto LAB_00106b7b;
          bVar24 = pbVar31[2];
          pbVar32 = pbVar31 + 2;
          while ((pbVar33 = pbVar32, local_3f38 = uVar27, local_3f30 = pbVar31, bVar24 != 0 &&
                 ((bVar24 == 0x5f || ((puVar2[bVar24] & 8) != 0))))) {
            bVar24 = pbVar32[1];
            pbVar32 = pbVar32 + 1;
          }
        }
        else if (((iVar3 == 0x3a) && (pbVar31[1] == 0x3a)) && (pbVar31[2] == 0x3d)) {
          pbVar32 = pbVar31 + 3;
          pbVar33 = pbVar32;
          local_3f38 = uVar27;
          local_3f30 = pbVar31;
        }
        else {
LAB_00106b7b:
          pbVar32 = pbVar31 + 1;
          pbVar33 = pbVar32;
          local_3f38 = uVar27;
          local_3f30 = pbVar31;
        }
      }
      else {
        bVar24 = *pbVar31;
        while ((pbVar33 = pbVar32, local_3f38 = uVar27, local_3f30 = pbVar31, bVar24 != 0 &&
               ((bVar24 == 0x5f || ((puVar2[bVar24] & 8) != 0))))) {
          bVar24 = pbVar32[1];
          pbVar32 = pbVar32 + 1;
        }
      }
      goto LAB_00106b90;
    }
    bVar24 = pbVar31[2];
    if (bVar24 == 0) {
      pbVar33 = pbVar31 + 2;
    }
    else {
      pbVar31 = pbVar31 + 3;
      do {
        pbVar33 = pbVar31;
        if (bVar24 == 10) {
          uVar27 = uVar27 + 1;
        }
        else if ((bVar24 == 0x2f) && (pbVar33[-2] == 0x2a)) {
          pbVar33 = pbVar33 + -1;
          lVar7 = 1;
          goto LAB_00106a4f;
        }
        bVar24 = *pbVar33;
        pbVar31 = pbVar33 + 1;
      } while (bVar24 != 0);
    }
    lVar7 = 0;
LAB_00106a4f:
    pbVar33 = pbVar33 + lVar7;
  } while( true );
LAB_00106a6f:
  do {
    pbVar32 = pbVar33;
    if ((iVar3 < 2) && (bVar24 == 0x7d)) {
      pbVar33 = pbVar9 + 2;
      local_3f38 = uVar27;
      local_3f30 = pbVar31;
      goto LAB_00106b90;
    }
    if (bVar24 < 0x2f) {
      if (bVar24 == 10) {
LAB_00106b56:
        uVar28 = uVar28 + 1;
      }
      else if ((bVar24 == 0x22) || (bVar24 == 0x27)) {
        bVar18 = pbVar32[1];
        pbVar32 = pbVar32 + 1;
        if (bVar18 != 0) {
          bVar25 = 0;
          do {
            if ((bVar25 != 0x5c) && (bVar18 == bVar24)) break;
            uVar28 = uVar28 + (bVar18 == 10);
            bVar38 = bVar25 == 0x5c;
            bVar25 = bVar18;
            if (bVar38) {
              bVar25 = 0;
            }
            bVar18 = pbVar32[1];
            pbVar32 = pbVar32 + 1;
          } while (bVar18 != 0);
        }
      }
    }
    else if (bVar24 == 0x2f) {
      if (pbVar9[2] == 0x2f) {
        for (pbVar32 = pbVar9 + 3; *pbVar32 != 0; pbVar32 = pbVar32 + 1) {
          if (*pbVar32 == 10) goto LAB_00106b56;
        }
      }
      else if (pbVar9[2] == 0x2a) {
        pbVar32 = pbVar9 + 3;
        if (pbVar9[3] != 0) {
          bVar24 = 0;
          bVar18 = pbVar9[3];
          do {
            if (bVar24 == 0x2a && bVar18 == 0x2f) break;
            uVar28 = uVar28 + (bVar18 == 10);
            pbVar33 = pbVar32 + 1;
            pbVar32 = pbVar32 + 1;
            bVar24 = bVar18;
            bVar18 = *pbVar33;
          } while (*pbVar33 != 0);
        }
      }
    }
    else if (bVar24 == 0x7b) {
      iVar3 = iVar3 + 1;
    }
    else if (bVar24 == 0x7d) {
      iVar3 = iVar3 + -1;
    }
    bVar24 = pbVar32[1];
    pbVar33 = pbVar32 + 1;
    pbVar9 = pbVar32;
  } while (bVar24 != 0);
LAB_001076c2:
  pbVar32 = pbVar33;
  local_3f38 = uVar27;
  local_3f30 = pbVar31;
  ErrorMsg(local_3f40,uVar27,
           "C code starting on this line is not terminated before the end of the file.");
  local_3f34 = local_3f34 + 1;
  pbVar33 = pbVar32;
LAB_00106b90:
  bVar24 = *pbVar32;
  *pbVar32 = 0;
  pbVar31 = (byte *)Strsafe((char *)local_3f30);
  prVar11 = local_70;
  uVar27 = local_3ef8;
  psVar13 = local_3f10;
  psVar15 = local_3f18;
  switch(local_3f20) {
  case 0:
    local_70 = (rule *)0x0;
    uStack_34 = 0;
    iStack_44 = 0;
    prStack_40 = (rule *)0x0;
    uStack_38 = 0;
    local_3f28->nrule = 0;
  case 1:
    uVar5 = (ulong)*pbVar31;
    if (uVar5 == 0x25) {
LAB_001070e4:
      local_3f20 = 2;
    }
    else if ((*(byte *)((long)*ppuVar10 + uVar5 * 2 + 1) & 2) == 0) {
      if (uVar5 == 0x5b) {
        local_3f20 = 0xc;
      }
      else if (*pbVar31 == 0x7b) {
        if (local_70 == (rule *)0x0) {
          Parse_cold_9();
          psVar15 = local_3f18;
        }
        else if (local_70->code == (char *)0x0) {
          local_70->line = local_3f38;
          local_70->code = (char *)(pbVar31 + 1);
          local_70->noCode = 0;
        }
        else {
          Parse_cold_8();
          psVar15 = local_3f18;
        }
      }
      else {
        pcVar20 = "Token \"%s\" should be either \"%%\" or a nonterminal name.";
LAB_00107c81:
        ErrorMsg(local_3f40,local_3f38,pcVar20,pbVar31);
        local_3f34 = local_3f34 + 1;
        psVar15 = local_3f18;
      }
    }
    else {
      local_3f08 = Symbol_new((char *)pbVar31);
      local_3ef8 = 0;
      local_3f00 = (byte *)0x0;
      local_3f20 = 5;
      psVar15 = local_3f18;
    }
    goto switchD_00106bca_default;
  case 2:
    if ((*(byte *)((long)*ppuVar10 + (ulong)*pbVar31 * 2 + 1) & 4) != 0) {
      local_60 = (char **)0x0;
      local_50 = (int *)0x0;
      local_58 = 1;
      local_3f20 = 3;
      local_68 = pbVar31;
      iVar3 = strcmp((char *)pbVar31,"name");
      if (iVar3 == 0) {
        local_60 = &local_3f28->name;
        goto LAB_00107624;
      }
      iVar3 = strcmp((char *)pbVar31,"include");
      if (iVar3 == 0) {
        local_60 = &local_3f28->include;
        psVar15 = local_3f18;
        goto switchD_00106bca_default;
      }
      iVar3 = strcmp((char *)pbVar31,"code");
      if (iVar3 == 0) {
        lVar7 = 0xa8;
      }
      else {
        iVar3 = strcmp((char *)pbVar31,"token_destructor");
        if (iVar3 == 0) {
          lVar7 = 0xb0;
        }
        else {
          iVar3 = strcmp((char *)pbVar31,"default_destructor");
          if (iVar3 == 0) {
            lVar7 = 0xb8;
          }
          else {
            iVar3 = strcmp((char *)pbVar31,"token_prefix");
            if (iVar3 == 0) {
              local_60 = &local_3f28->tokenprefix;
LAB_00107624:
              local_58 = 0;
              psVar15 = local_3f18;
              goto switchD_00106bca_default;
            }
            iVar3 = strcmp((char *)pbVar31,"syntax_error");
            if (iVar3 == 0) {
              lVar7 = 0x88;
            }
            else {
              iVar3 = strcmp((char *)pbVar31,"parse_accept");
              if (iVar3 == 0) {
                lVar7 = 0xa0;
              }
              else {
                iVar3 = strcmp((char *)pbVar31,"parse_failure");
                if (iVar3 == 0) {
                  lVar7 = 0x98;
                }
                else {
                  iVar3 = strcmp((char *)pbVar31,"stack_overflow");
                  if (iVar3 != 0) {
                    iVar3 = strcmp((char *)pbVar31,"extra_argument");
                    if (iVar3 == 0) {
                      local_60 = &local_3f28->arg;
                    }
                    else {
                      iVar3 = strcmp((char *)pbVar31,"token_type");
                      if (iVar3 == 0) {
                        local_60 = &local_3f28->tokentype;
                      }
                      else {
                        iVar3 = strcmp((char *)pbVar31,"default_type");
                        if (iVar3 == 0) {
                          local_60 = &local_3f28->vartype;
                        }
                        else {
                          iVar3 = strcmp((char *)pbVar31,"stack_size");
                          if (iVar3 == 0) {
                            local_60 = &local_3f28->stacksize;
                          }
                          else {
                            iVar3 = strcmp((char *)pbVar31,"start_symbol");
                            if (iVar3 != 0) {
                              iVar3 = strcmp((char *)pbVar31,"left");
                              if (iVar3 == 0) {
                                iStack_44 = iStack_44 + 1;
                                local_48 = 0;
                              }
                              else {
                                iVar3 = strcmp((char *)pbVar31,"right");
                                if (iVar3 == 0) {
                                  iStack_44 = iStack_44 + 1;
                                  local_48 = 1;
                                }
                                else {
                                  iVar3 = strcmp((char *)pbVar31,"nonassoc");
                                  if (iVar3 != 0) {
                                    iVar3 = strcmp((char *)pbVar31,"destructor");
                                    if (iVar3 == 0) {
                                      local_3f20 = 0x10;
                                      psVar15 = local_3f18;
                                      goto switchD_00106bca_default;
                                    }
                                    iVar3 = strcmp((char *)pbVar31,"type");
                                    if (iVar3 == 0) {
                                      local_3f20 = 0x11;
                                      psVar15 = local_3f18;
                                      goto switchD_00106bca_default;
                                    }
                                    iVar3 = strcmp((char *)pbVar31,"fallback");
                                    if (iVar3 == 0) {
                                      local_3f18 = (symbol *)0x0;
                                      local_3f20 = 0x12;
                                      psVar15 = local_3f18;
                                      goto switchD_00106bca_default;
                                    }
                                    iVar3 = strcmp((char *)pbVar31,"wildcard");
                                    if (iVar3 == 0) {
                                      local_3f20 = 0x13;
                                      psVar15 = local_3f18;
                                      goto switchD_00106bca_default;
                                    }
                                    iVar3 = strcmp((char *)pbVar31,"token_class");
                                    if (iVar3 == 0) {
                                      local_3f20 = 0x14;
                                      psVar15 = local_3f18;
                                      goto switchD_00106bca_default;
                                    }
                                    pcVar20 = "Unknown declaration keyword: \"%%%s\".";
                                    goto LAB_00107bdb;
                                  }
                                  iStack_44 = iStack_44 + 1;
                                  local_48 = 2;
                                }
                              }
                              local_3f20 = 4;
                              psVar15 = local_3f18;
                              goto switchD_00106bca_default;
                            }
                            local_60 = &local_3f28->start;
                          }
                        }
                      }
                    }
                    goto LAB_00107624;
                  }
                  lVar7 = 0x90;
                }
              }
            }
          }
        }
      }
      local_60 = (char **)((long)&local_3f28->sorted + lVar7);
      psVar15 = local_3f18;
      goto switchD_00106bca_default;
    }
    pcVar20 = "Illegal declaration keyword: \"%s\".";
    goto LAB_00107bdb;
  case 3:
    bVar18 = *pbVar31;
    if (((bVar18 == 0x22) || (bVar18 == 0x7b)) || (((*ppuVar10)[bVar18] & 8) != 0)) {
      if (((ulong)bVar18 == 0x7b) || (bVar18 == 0x22)) {
        pbVar31 = pbVar31 + 1;
      }
      sVar6 = strlen((char *)pbVar31);
      ppcVar36 = local_60;
      pcVar20 = *local_60;
      pcVar26 = pcVar20;
      if (pcVar20 == (char *)0x0) {
        pcVar26 = "";
      }
      sVar29 = strlen(pcVar26);
      iVar3 = (int)sVar6;
      iVar23 = (int)sVar29;
      iVar4 = iVar3 + iVar23 + 0x14;
      if ((local_3f28->nolinenosflag == 0) && (local_58 != 0)) {
        if ((local_50 == (int *)0x0) || (*local_50 != 0)) {
          iVar22 = 0;
          pcVar20 = local_3f40;
          do {
            if (*pcVar20 == '\\') {
              iVar22 = iVar22 + 1;
            }
            else if (*pcVar20 == '\0') goto LAB_001075ad;
            pcVar20 = pcVar20 + 1;
          } while( true );
        }
        bVar38 = false;
        local_3fd0 = 0;
      }
      else {
        local_3fd0 = 0;
        bVar38 = false;
      }
      goto LAB_00107776;
    }
    ErrorMsg(local_3f40,local_3f38,"Illegal argument to %%%s: %s",local_68,pbVar31);
    goto LAB_00107be2;
  case 4:
    if ((ulong)*pbVar31 == 0x2e) break;
    if ((*(byte *)((long)*ppuVar10 + (ulong)*pbVar31 * 2 + 1) & 1) == 0) {
      pcVar20 = "Can\'t assign a precedence to \"%s\".";
    }
    else {
      psVar13 = Symbol_new((char *)pbVar31);
      if (psVar13->prec < 0) {
        psVar13->prec = iStack_44;
        psVar13->assoc = local_48;
        psVar15 = local_3f18;
        goto switchD_00106bca_default;
      }
      pcVar20 = "Symbol \"%s\" has already be given a precedence.";
    }
    goto LAB_00107c81;
  case 5:
    if (*pbVar31 == 0x28) {
      local_3f20 = 7;
      goto switchD_00106bca_default;
    }
    if (((*pbVar31 != 0x3a) || (pbVar31[1] != 0x3a)) || (pbVar31[2] != 0x3d)) {
      pbVar31 = (byte *)local_3f08->name;
      pcVar20 = "Expected to see a \":\" following the LHS symbol \"%s\".";
      goto LAB_0010788c;
    }
    goto LAB_001071d5;
  case 6:
    bVar18 = *pbVar31;
    uVar5 = (ulong)bVar18;
    if (uVar5 != 0x2e) {
      if ((*(byte *)((long)*ppuVar10 + uVar5 * 2 + 1) & 4) == 0) {
        if (uVar5 == 0x28) {
          if (0 < (int)local_3ef8) {
            local_3f20 = 10;
            goto switchD_00106bca_default;
          }
        }
        else if (((bVar18 == 0x7c) || (bVar18 == 0x2f)) && (0 < (int)local_3ef8)) {
          uVar27 = local_3ef8 - 1;
          puVar12 = (undefined8 *)alStack_3ef0[uVar27];
          if (*(int *)((long)puVar12 + 0xc) == 2) {
            __ptr = (long *)puVar12[0xb];
            iVar3 = *(int *)((long)puVar12 + 0x54) + 1;
            puVar16 = puVar12;
          }
          else {
            puVar16 = (undefined8 *)calloc(1,0x60);
            *(undefined4 *)((long)puVar16 + 0xc) = 2;
            *(undefined4 *)((long)puVar16 + 0x54) = 1;
            __ptr = (long *)calloc(1,8);
            puVar16[0xb] = __ptr;
            *__ptr = (long)puVar12;
            *puVar16 = *puVar12;
            alStack_3ef0[uVar27] = (long)puVar16;
            iVar3 = 2;
          }
          *(int *)((long)puVar16 + 0x54) = iVar3;
          pvVar17 = realloc(__ptr,(long)iVar3 << 3);
          puVar16[0xb] = pvVar17;
          psVar13 = Symbol_new((char *)(pbVar31 + 1));
          *(symbol **)(puVar16[0xb] + -8 + (long)*(int *)((long)puVar16 + 0x54) * 8) = psVar13;
          if (((*(byte *)((long)*ppuVar10 + (ulong)pbVar31[1] * 2 + 1) & 2) != 0) ||
             (psVar15 = local_3f18,
             (*(byte *)((long)*ppuVar10 + (ulong)*(byte *)**(undefined8 **)puVar16[0xb] * 2 + 1) & 2
             ) != 0)) {
            Parse_cold_3();
            psVar15 = local_3f18;
          }
          goto switchD_00106bca_default;
        }
        pcVar20 = "Illegal character on RHS of rule: \"%s\".";
      }
      else {
        lVar7 = (long)(int)local_3ef8;
        if (lVar7 < 1000) {
          psVar13 = Symbol_new((char *)pbVar31);
          alStack_3ef0[lVar7] = (long)psVar13;
          auStack_1fb8[lVar7 + 1] = 0;
          local_3ef8 = uVar27 + 1;
          psVar15 = local_3f18;
          goto switchD_00106bca_default;
        }
        pcVar20 = "Too many symbols on RHS of rule beginning at \"%s\".";
      }
      goto LAB_0010788c;
    }
    uVar5 = (ulong)local_3ef8;
    lVar7 = (long)(int)local_3ef8;
    prVar11 = (rule *)calloc(lVar7 * 0x10 + 0x80,1);
    if (prVar11 == (rule *)0x0) {
      Parse_cold_4();
      local_70 = prVar11;
    }
    else {
      prVar11->ruleline = local_3f38;
      prVar11->rhs = &prVar11[1].lhs;
      prVar11->rhsalias = (char **)(&prVar11[1].lhs + lVar7);
      if (0 < (int)uVar27) {
        uVar34 = 0;
        do {
          prVar11->rhs[uVar34] = (symbol *)alStack_3ef0[uVar34];
          prVar11->rhsalias[uVar34] = (char *)auStack_1fb8[uVar34 + 1];
          uVar34 = uVar34 + 1;
        } while (uVar5 != uVar34);
      }
      prVar11->lhs = local_3f08;
      prVar11->lhsalias = (char *)local_3f00;
      prVar11->nrhs = uVar27;
      prVar11->code = (char *)0x0;
      prVar11->noCode = 1;
      prVar11->precsym = (symbol *)0x0;
      iVar3 = local_3f28->nrule;
      local_3f28->nrule = iVar3 + 1;
      prVar11->index = iVar3;
      prVar11->nextlhs = local_3f08->rule;
      local_3f08->rule = prVar11;
      prVar11->next = (rule *)0x0;
      puVar12 = (undefined8 *)(CONCAT44(uStack_34,uStack_38) + 0x78);
      if (prStack_40 == (rule *)0x0) {
        puVar12 = (undefined8 *)&uStack_38;
      }
      *puVar12 = prVar11;
      (&prStack_40)[prStack_40 != (rule *)0x0] = prVar11;
      local_70 = prVar11;
    }
    break;
  case 7:
    if ((*(byte *)((long)*ppuVar10 + (ulong)*pbVar31 * 2 + 1) & 4) != 0) {
      local_3f20 = 8;
      local_3f00 = pbVar31;
      goto switchD_00106bca_default;
    }
    pbVar9 = (byte *)local_3f08->name;
    pcVar20 = "\"%s\" is not a valid alias for the LHS \"%s\"\n";
    goto LAB_00107a6e;
  case 8:
    if (*pbVar31 == 0x29) {
      local_3f20 = 9;
      goto switchD_00106bca_default;
    }
LAB_00107737:
    pcVar20 = "Missing \")\" following LHS alias name \"%s\".";
    pbVar31 = local_3f00;
LAB_0010788c:
    ErrorMsg(local_3f40,local_3f38,pcVar20,pbVar31);
    goto LAB_00107a75;
  case 9:
    if (((*pbVar31 != 0x3a) || (pbVar31[1] != 0x3a)) || (pbVar31[2] != 0x3d)) {
      pbVar31 = (byte *)local_3f08->name;
      pcVar20 = "Missing \"->\" following: \"%s(%s)\".";
      pbVar9 = local_3f00;
      goto LAB_00107a6e;
    }
    goto LAB_001071d5;
  case 10:
    if ((*(byte *)((long)*ppuVar10 + (ulong)*pbVar31 * 2 + 1) & 4) != 0) {
      auStack_1fb8[(int)local_3ef8] = pbVar31;
      local_3f20 = 0xb;
      goto switchD_00106bca_default;
    }
    pbVar9 = *(byte **)alStack_3ef0[(long)(int)local_3ef8 + -1];
    pcVar20 = "\"%s\" is not a valid alias for the RHS symbol \"%s\"\n";
LAB_00107a6e:
    ErrorMsg(local_3f40,local_3f38,pcVar20,pbVar31,pbVar9);
LAB_00107a75:
    local_3f34 = local_3f34 + 1;
    local_3f20 = 0xe;
    psVar15 = local_3f18;
    goto switchD_00106bca_default;
  case 0xb:
    if (*pbVar31 != 0x29) goto LAB_00107737;
LAB_001071d5:
    local_3f20 = 6;
    goto switchD_00106bca_default;
  case 0xc:
    if ((*(byte *)((long)*ppuVar10 + (ulong)*pbVar31 * 2 + 1) & 1) == 0) {
      Parse_cold_7();
    }
    else if (local_70 == (rule *)0x0) {
      ErrorMsg(local_3f40,local_3f38,"There is no prior rule to assign precedence \"[%s]\".");
      local_3f34 = local_3f34 + 1;
    }
    else if (local_70->precsym == (symbol *)0x0) {
      psVar13 = Symbol_new((char *)pbVar31);
      prVar11->precsym = psVar13;
    }
    else {
      Parse_cold_6();
    }
    local_3f20 = 0xd;
    psVar15 = local_3f18;
    goto switchD_00106bca_default;
  case 0xd:
    if (*pbVar31 != 0x5d) {
      Parse_cold_5();
    }
    break;
  case 0xe:
  case 0xf:
    bVar18 = *pbVar31;
    if (bVar18 == 0x2e) {
      local_3f20 = 1;
      bVar18 = *pbVar31;
    }
    if (bVar18 != 0x25) goto switchD_00106bca_default;
    goto LAB_001070e4;
  case 0x10:
    if ((*(byte *)((long)*ppuVar10 + (ulong)*pbVar31 * 2 + 1) & 4) != 0) {
      psVar13 = Symbol_new((char *)pbVar31);
      local_60 = &psVar13->destructor;
      local_50 = &psVar13->destLineno;
      local_58 = 1;
      local_3f20 = 3;
      psVar15 = local_3f18;
      goto switchD_00106bca_default;
    }
    pcVar20 = "Symbol name missing after %%destructor keyword";
    goto LAB_00107a1b;
  case 0x11:
    if ((*(byte *)((long)*ppuVar10 + (ulong)*pbVar31 * 2 + 1) & 4) != 0) {
      psVar13 = Symbol_find((char *)pbVar31);
      if (psVar13 == (symbol *)0x0) {
        psVar13 = Symbol_new((char *)pbVar31);
      }
      else if (psVar13->datatype != (char *)0x0) {
        ErrorMsg(local_3f40,local_3f38,"Symbol %%type \"%s\" already defined",pbVar31);
        local_3f34 = local_3f34 + 1;
        local_3f20 = 0xf;
        psVar15 = local_3f18;
        goto switchD_00106bca_default;
      }
      local_60 = &psVar13->datatype;
      local_58 = 0;
      local_3f20 = 3;
      psVar15 = local_3f18;
      goto switchD_00106bca_default;
    }
    pcVar20 = "Symbol name missing after %%type keyword";
LAB_00107a1b:
    ErrorMsg(local_3f40,local_3f38,pcVar20);
    goto LAB_00107be2;
  case 0x12:
    if ((ulong)*pbVar31 != 0x2e) {
      if ((*(byte *)((long)*ppuVar10 + (ulong)*pbVar31 * 2 + 1) & 1) == 0) {
        pcVar20 = "%%fallback argument \"%s\" should be a token";
      }
      else {
        psVar15 = Symbol_new((char *)pbVar31);
        if (local_3f18 == (symbol *)0x0) goto switchD_00106bca_default;
        if (psVar15->fallback == (symbol *)0x0) {
          psVar15->fallback = local_3f18;
          local_3f28->has_fallback = 1;
          psVar15 = local_3f18;
          goto switchD_00106bca_default;
        }
        pcVar20 = "More than one fallback assigned to token %s";
      }
      goto LAB_00107c81;
    }
    break;
  case 0x13:
    if ((ulong)*pbVar31 != 0x2e) {
      if ((*(byte *)((long)*ppuVar10 + (ulong)*pbVar31 * 2 + 1) & 1) == 0) {
        pcVar20 = "%%wildcard argument \"%s\" should be a token";
      }
      else {
        psVar13 = Symbol_new((char *)pbVar31);
        if (local_3f28->wildcard == (symbol *)0x0) {
          local_3f28->wildcard = psVar13;
          psVar15 = local_3f18;
          goto switchD_00106bca_default;
        }
        pcVar20 = "Extra wildcard to token: %s";
      }
      goto LAB_00107c81;
    }
    break;
  case 0x14:
    if ((*(byte *)((long)*ppuVar10 + (ulong)*pbVar31 * 2 + 1) & 2) == 0) {
      pcVar20 = "%%token_class must be followed by an identifier: ";
    }
    else {
      psVar13 = Symbol_find((char *)pbVar31);
      if (psVar13 == (symbol *)0x0) {
        local_3f10 = Symbol_new((char *)pbVar31);
        local_3f10->type = MULTITERMINAL;
        local_3f20 = 0x15;
        psVar15 = local_3f18;
        goto switchD_00106bca_default;
      }
      pcVar20 = "Symbol \"%s\" already used";
    }
    goto LAB_00107bdb;
  case 0x15:
    uVar5 = (ulong)*pbVar31;
    if (uVar5 == 0x2e) break;
    if (((*(byte *)((long)*ppuVar10 + uVar5 * 2 + 1) & 1) != 0) ||
       (((uVar5 == 0x7c || (*pbVar31 == 0x2f)) &&
        ((*(byte *)((long)*ppuVar10 + (ulong)pbVar31[1] * 2 + 1) & 1) != 0)))) {
      iVar3 = local_3f10->nsubsym;
      local_3f10->nsubsym = iVar3 + 1;
      ppsVar14 = (symbol **)realloc(local_3f10->subsym,(long)iVar3 * 8 + 8);
      psVar13->subsym = ppsVar14;
      psVar15 = Symbol_new((char *)(pbVar31 + (((*ppuVar10)[*pbVar31] >> 8 & 1) == 0)));
      psVar13->subsym[(long)psVar13->nsubsym + -1] = psVar15;
      psVar15 = local_3f18;
      goto switchD_00106bca_default;
    }
    pcVar20 = "%%token_class argument \"%s\" should be a token";
LAB_00107bdb:
    ErrorMsg(local_3f40,local_3f38,pcVar20,pbVar31);
LAB_00107be2:
    local_3f34 = local_3f34 + 1;
    local_3f20 = 0xf;
    psVar15 = local_3f18;
  default:
    goto switchD_00106bca_default;
  }
LAB_00107842:
  local_3f20 = 1;
  psVar15 = local_3f18;
switchD_00106bca_default:
  local_3f18 = psVar15;
  *pbVar32 = bVar24;
  uVar27 = uVar28;
  goto LAB_001068e9;
LAB_001075ad:
  sprintf(local_3f78,"#line %d ",(ulong)local_3f38);
  sVar6 = strlen(local_3f78);
  sVar29 = strlen(local_3f40);
  iVar4 = iVar22 + iVar4 + (int)sVar6 + (int)sVar29;
  local_3fd0 = (size_t)(int)sVar6;
  pcVar20 = *local_60;
  bVar38 = true;
  ppcVar36 = local_60;
LAB_00107776:
  pcVar20 = (char *)realloc(pcVar20,(long)iVar4);
  *ppcVar36 = pcVar20;
  pcVar20 = *local_60 + iVar23;
  if (bVar38) {
    if ((iVar23 != 0) && (pcVar20[-1] != '\n')) {
      *pcVar20 = '\n';
      pcVar20 = pcVar20 + 1;
    }
    memcpy(pcVar20,local_3f78,local_3fd0);
    pcVar26 = pcVar20 + local_3fd0;
    pcVar20[local_3fd0] = '\"';
    pcVar20 = local_3f40;
    do {
      cVar21 = *pcVar20;
      if (cVar21 == '\\') {
        pcVar26[1] = '\\';
        pcVar26 = pcVar26 + 2;
        cVar21 = *pcVar20;
      }
      else {
        if (cVar21 == '\0') goto LAB_00107802;
        pcVar26 = pcVar26 + 1;
      }
      *pcVar26 = cVar21;
      pcVar20 = pcVar20 + 1;
    } while( true );
  }
  goto LAB_0010780f;
LAB_00107802:
  pcVar26[1] = '\"';
  pcVar26[2] = '\n';
  pcVar20 = pcVar26 + 3;
LAB_0010780f:
  if ((local_50 != (int *)0x0) && (*local_50 == 0)) {
    *local_50 = local_3f38;
  }
  memcpy(pcVar20,pbVar31,(long)iVar3);
  pcVar20[iVar3] = '\0';
  goto LAB_00107842;
}

Assistant:

void Parse(struct lemon *gp)
{
  struct pstate ps;
  FILE *fp;
  char *filebuf;
  int filesize;
  int lineno;
  int c;
  char *cp, *nextcp;
  int startline = 0;

  memset(&ps, '\0', sizeof(ps));
  ps.gp = gp;
  ps.filename = gp->filename;
  ps.errorcnt = 0;
  ps.state = INITIALIZE;

  /* Begin by reading the input file */
  fp = fopen(ps.filename,"rb");
  if( fp==0 ){
    ErrorMsg(ps.filename,0,"Can't open this file for reading.");
    gp->errorcnt++;
    return;
  }
  fseek(fp,0,2);
  filesize = ftell(fp);
  rewind(fp);
  filebuf = (char *)malloc( filesize+1 );
  if( filesize>100000000 || filebuf==0 ){
    ErrorMsg(ps.filename,0,"Input file too large.");
    gp->errorcnt++;
    fclose(fp);
    return;
  }
  if( fread(filebuf,1,filesize,fp)!=filesize ){
    ErrorMsg(ps.filename,0,"Can't read in all %d bytes of this file.",
      filesize);
    free(filebuf);
    gp->errorcnt++;
    fclose(fp);
    return;
  }
  fclose(fp);
  filesize = strip_crlf(filebuf, filesize);
  filebuf[filesize] = 0;

  /* Make an initial pass through the file to handle %ifdef and %ifndef */
  preprocess_input(filebuf);

  /* Now scan the text of the input file */
  lineno = 1;
  for(cp=filebuf; (c= *cp)!=0; ){
    if( c=='\n' ) lineno++;              /* Keep track of the line number */
    if( ISSPACE(c) ){ cp++; continue; }  /* Skip all white space */
    if( c=='/' && cp[1]=='/' ){          /* Skip C++ style comments */
      cp+=2;
      while( (c= *cp)!=0 && c!='\n' ) cp++;
      continue;
    }
    if( c=='/' && cp[1]=='*' ){          /* Skip C style comments */
      cp+=2;
      while( (c= *cp)!=0 && (c!='/' || cp[-1]!='*') ){
        if( c=='\n' ) lineno++;
        cp++;
      }
      if( c ) cp++;
      continue;
    }
    ps.tokenstart = cp;                /* Mark the beginning of the token */
    ps.tokenlineno = lineno;           /* Linenumber on which token begins */
    if( c=='\"' ){                     /* String literals */
      cp++;
      while( (c= *cp)!=0 && c!='\"' ){
        if( c=='\n' ) lineno++;
        cp++;
      }
      if( c==0 ){
        ErrorMsg(ps.filename,startline,
"String starting on this line is not terminated before the end of the file.");
        ps.errorcnt++;
        nextcp = cp;
      }else{
        nextcp = cp+1;
      }
    }else if( c=='{' ){               /* A block of C code */
      int level;
      cp++;
      for(level=1; (c= *cp)!=0 && (level>1 || c!='}'); cp++){
        if( c=='\n' ) lineno++;
        else if( c=='{' ) level++;
        else if( c=='}' ) level--;
        else if( c=='/' && cp[1]=='*' ){  /* Skip comments */
          int prevc;
          cp = &cp[2];
          prevc = 0;
          while( (c= *cp)!=0 && (c!='/' || prevc!='*') ){
            if( c=='\n' ) lineno++;
            prevc = c;
            cp++;
	  }
	}else if( c=='/' && cp[1]=='/' ){  /* Skip C++ style comments too */
          cp = &cp[2];
          while( (c= *cp)!=0 && c!='\n' ) cp++;
          if( c ) lineno++;
	}else if( c=='\'' || c=='\"' ){    /* String a character literals */
          int startchar, prevc;
          startchar = c;
          prevc = 0;
          for(cp++; (c= *cp)!=0 && (c!=startchar || prevc=='\\'); cp++){
            if( c=='\n' ) lineno++;
            if( prevc=='\\' ) prevc = 0;
            else              prevc = c;
	  }
	}
      }
      if( c==0 ){
        ErrorMsg(ps.filename,ps.tokenlineno,
"C code starting on this line is not terminated before the end of the file.");
        ps.errorcnt++;
        nextcp = cp;
      }else{
        nextcp = cp+1;
      }
    }else if( ISALNUM(c) ){          /* Identifiers */
      while( (c= *cp)!=0 && (ISALNUM(c) || c=='_') ) cp++;
      nextcp = cp;
    }else if( c==':' && cp[1]==':' && cp[2]=='=' ){ /* The operator "::=" */
      cp += 3;
      nextcp = cp;
    }else if( (c=='/' || c=='|') && ISALPHA(cp[1]) ){
      cp += 2;
      while( (c = *cp)!=0 && (ISALNUM(c) || c=='_') ) cp++;
      nextcp = cp;
    }else{                          /* All other (one character) operators */
      cp++;
      nextcp = cp;
    }
    c = *cp;
    *cp = 0;                        /* Null terminate the token */
    parseonetoken(&ps);             /* Parse the token */
    *cp = c;                        /* Restore the buffer */
    cp = nextcp;
  }
  free(filebuf);                    /* Release the buffer after parsing */
  gp->rule = ps.firstrule;
  gp->errorcnt = ps.errorcnt;
}